

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

void Wlc_PrsStop(Wlc_Prs_t *p)

{
  Wlc_Prs_t *p_local;
  
  if (p->pNtk != (Wlc_Ntk_t *)0x0) {
    Wlc_NtkFree(p->pNtk);
  }
  if (p->pMemTable != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemTable,0);
  }
  Vec_StrFreeP(&p->vPoPairs);
  Vec_PtrFreeP(&p->vTables);
  Vec_IntFree(p->vLines);
  Vec_IntFree(p->vStarts);
  Vec_IntFree(p->vFanins);
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if (p != (Wlc_Prs_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Wlc_PrsStop( Wlc_Prs_t * p )
{
    if ( p->pNtk )
        Wlc_NtkFree( p->pNtk );
    if ( p->pMemTable )
        Mem_FlexStop( p->pMemTable, 0 );
    Vec_StrFreeP( &p->vPoPairs );
    Vec_PtrFreeP( &p->vTables );
    Vec_IntFree( p->vLines );
    Vec_IntFree( p->vStarts );
    Vec_IntFree( p->vFanins );
    ABC_FREE( p->pBuffer );
    ABC_FREE( p );
}